

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_operator_expression.cpp
# Opt level: O2

bool __thiscall
duckdb::BoundOperatorExpression::Equals(BoundOperatorExpression *this,BaseExpression *other_p)

{
  bool bVar1;
  BoundOperatorExpression *pBVar2;
  
  bVar1 = Expression::Equals(&this->super_Expression,other_p);
  if (bVar1) {
    pBVar2 = BaseExpression::Cast<duckdb::BoundOperatorExpression>(other_p);
    bVar1 = Expression::ListEquals(&this->children,&pBVar2->children);
    return bVar1;
  }
  return false;
}

Assistant:

bool BoundOperatorExpression::Equals(const BaseExpression &other_p) const {
	if (!Expression::Equals(other_p)) {
		return false;
	}
	auto &other = other_p.Cast<BoundOperatorExpression>();
	if (!Expression::ListEquals(children, other.children)) {
		return false;
	}
	return true;
}